

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::ArgumentMismatch::ArgumentMismatch(ArgumentMismatch *this,string *msg)

{
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"ArgumentMismatch",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)msg);
  ArgumentMismatch(this,&local_30,&local_50,ArgumentMismatch);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ArgumentMismatch(std::string name, int expected, size_t recieved)
        : ArgumentMismatch(expected > 0 ? ("Expected exactly " + std::to_string(expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved))
                                        : ("Expected at least " + std::to_string(-expected) + " arguments to " + name +
                                           ", got " + std::to_string(recieved)),
                           ExitCodes::ArgumentMismatch) {}